

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
llvm::SmallVectorImpl<char_const*>::append<char_const**,void>
          (SmallVectorImpl<char_const*> *this,char **in_start,char **in_end)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (long)in_end - (long)in_start >> 3;
  uVar2 = (ulong)*(uint *)(this + 8);
  if (*(uint *)(this + 0xc) - uVar2 < uVar3) {
    SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 0x10,uVar2 + uVar3,8);
    uVar2 = (ulong)*(uint *)(this + 8);
  }
  uVar1 = (uint)uVar2;
  if (in_start != in_end) {
    memcpy((void *)(uVar2 * 8 + *(long *)this),in_start,(long)in_end - (long)in_start);
    uVar1 = *(uint *)(this + 8);
  }
  if (uVar3 + uVar1 <= (ulong)*(uint *)(this + 0xc)) {
    *(int *)(this + 8) = (int)(uVar3 + uVar1);
    return;
  }
  __assert_fail("Size <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > this->capacity() - this->size())
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->set_size(this->size() + NumInputs);
  }